

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__loop_alive(uv_loop_t *loop)

{
  int iVar1;
  bool local_11;
  uv_loop_t *loop_local;
  
  local_11 = true;
  if ((loop->active_handles == 0) && (local_11 = true, (loop->active_reqs).count == 0)) {
    iVar1 = uv__queue_empty(&loop->pending_queue);
    local_11 = true;
    if (iVar1 != 0) {
      local_11 = loop->closing_handles != (uv_handle_t *)0x0;
    }
  }
  return (int)local_11;
}

Assistant:

static int uv__loop_alive(const uv_loop_t* loop) {
  return uv__has_active_handles(loop) ||
         uv__has_active_reqs(loop) ||
         !uv__queue_empty(&loop->pending_queue) ||
         loop->closing_handles != NULL;
}